

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTexture1DProj2Bias(ShaderEvalContext *c,TexLookupParams *p)

{
  Texture1D *pTVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pTVar1 = c->textures[0].tex1D;
  tcu::sampleLevelArray1D
            ((ConstPixelBufferAccess *)&local_28,(int)(pTVar1->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar1->m_view).m_numLevels,
             c->in[0].m_data[0] / c->in[0].m_data[1],(int)c + 0x70,p->lod + c->in[1].m_data[0]);
  fVar2 = (p->scale).m_data[1];
  fVar3 = (p->scale).m_data[2];
  fVar4 = (p->scale).m_data[3];
  fVar5 = (p->bias).m_data[1];
  fVar6 = (p->bias).m_data[2];
  fVar7 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * local_28 + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar2 * fStack_24 + fVar5;
  (c->color).m_data[2] = fVar3 * fStack_20 + fVar6;
  (c->color).m_data[3] = fVar4 * fStack_1c + fVar7;
  return;
}

Assistant:

static void		evalTexture1DProj2Bias	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture1D(c, c.in[0].x()/c.in[0].y(), p.lod+c.in[1].x())*p.scale + p.bias; }